

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_base.cpp
# Opt level: O1

void mpp_data_update_v2(MppDataV2 *p,RK_S32 val)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 uVar3;
  undefined8 uVar4;
  
  uVar3 = (undefined4)((ulong)in_RAX >> 0x20);
  if (p->pos_ahead == 0) {
    if (p == (MppDataV2 *)0x0) {
      uVar4 = CONCAT44(uVar3,0x7b);
      _mpp_log_l(2,"rc_base","Assertion %s failed at %s:%d\n",(char *)0x0,"p","mpp_data_update_v2",
                 uVar4);
      uVar3 = (undefined4)((ulong)uVar4 >> 0x20);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_002459bb;
    }
    if (p->pos_r == p->size) {
      p->pos_r = p->pos_r + -1;
      p->sum = p->sum - (long)(&p[1].size)[p->pos_w];
    }
    if (p->size <= p->pos_r) {
      _mpp_log_l(2,"rc_base","Assertion %s failed at %s:%d\n",(char *)0x0,"p->pos_r < p->size",
                 "mpp_data_update_v2",CONCAT44(uVar3,0x80));
      if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_002459bb:
        abort();
      }
    }
    (&p[1].size)[p->pos_w] = val;
    p->sum = p->sum + (long)(&p[1].size)[p->pos_w];
    iVar2 = p->pos_w + 1;
    p->pos_w = iVar2;
    p->pos_r = p->pos_r + 1;
    if (p->size <= iVar2) {
      p->pos_w = 0;
    }
  }
  else {
    p->sum = p->sum + ((long)val - (long)(&p[1].size)[p->pos_w]);
    (&p[1].size)[p->pos_w] = val;
    iVar1 = p->pos_w + 1;
    iVar2 = 0;
    if (iVar1 < p->size) {
      iVar2 = iVar1;
    }
    p->pos_w = iVar2;
    p->pos_ahead = p->pos_ahead + -1;
  }
  return;
}

Assistant:

void mpp_data_update_v2(MppDataV2 *p, RK_S32 val)
{
    if (p->pos_ahead) {
        p->sum += val - p->val[p->pos_w];
        p->val[p->pos_w] = val;
        p->pos_w++;
        if (p->pos_w >= p->size)
            p->pos_w = 0;

        p->pos_ahead--;

        return;
    }

    mpp_assert(p);
    if (p->pos_r == p->size) {
        p->pos_r--;
        p->sum -= p->val[p->pos_w];
    }
    mpp_assert(p->pos_r < p->size);
    p->val[p->pos_w] = val;
    p->sum += p->val[p->pos_w];
    p->pos_w++;
    p->pos_r++;
    if (p->pos_w >= p->size)
        p->pos_w = 0;
}